

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::putIntoGlobalNamesMap
          (CheckerVisitor *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
          *map,DiagnosticsId diag,SQChar *name,Node *d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  iterator iVar3;
  iterator __position;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_bool>
  pVar5;
  string key;
  string sourcenameCache;
  IdLocation local_c0;
  key_type local_a8;
  key_type local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>
  local_68;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,this->_ctx->_sourceName,(allocator<char> *)&local_68);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)fileNames_abi_cxx11_,&local_88);
  if (iVar2._M_node == (_Base_ptr)(fileNames_abi_cxx11_ + 8)) {
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)fileNames_abi_cxx11_,&local_88);
    iVar2._M_node = (_Base_ptr)pVar4.first._M_node;
  }
  local_c0.filename = *(char **)(iVar2._M_node + 1);
  local_c0.line = (d->_coordinates).lineStart;
  local_c0.column = (d->_coordinates).columnStart;
  local_c0.diagSilenced =
       SQCompilationContext::isDisabled(this->_ctx,diag,local_c0.line,local_c0.column);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,name,(allocator<char> *)&local_68);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
          ::find(&map->_M_t,&local_a8);
  if ((_Rb_tree_header *)iVar3._M_node == &(map->_M_t)._M_impl.super__Rb_tree_header) {
    paVar1 = &local_68.first.field_2;
    local_68.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    local_68.second.
    super__Vector_base<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.second.
    super__Vector_base<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.second.
    super__Vector_base<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>>>
            ::
            _M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>>>>
                        *)map,&local_68);
    iVar3._M_node = (_Base_ptr)pVar5.first._M_node;
    if (local_68.second.
        super__Vector_base<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.second.
                      super__Vector_base<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.second.
                            super__Vector_base<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.second.
                            super__Vector_base<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.first._M_dataplus._M_p,
                      local_68.first.field_2._M_allocated_capacity + 1);
    }
    __position._M_current = (IdLocation *)iVar3._M_node[2]._M_parent;
    if ((_Base_ptr)__position._M_current == iVar3._M_node[2]._M_left) {
      std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>::
      _M_realloc_insert<SQCompilation::IdLocation_const&>
                ((vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>> *)
                 (iVar3._M_node + 2),__position,&local_c0);
      goto LAB_00150622;
    }
  }
  else {
    __position._M_current = (IdLocation *)iVar3._M_node[2]._M_parent;
    if ((_Base_ptr)__position._M_current == iVar3._M_node[2]._M_left) {
      std::vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>>::
      _M_realloc_insert<SQCompilation::IdLocation_const&>
                ((vector<SQCompilation::IdLocation,std::allocator<SQCompilation::IdLocation>> *)
                 (iVar3._M_node + 2),__position,&local_c0);
      goto LAB_00150622;
    }
  }
  *(ulong *)&(__position._M_current)->diagSilenced = CONCAT71(local_c0._17_7_,local_c0.diagSilenced)
  ;
  (__position._M_current)->filename = local_c0.filename;
  (__position._M_current)->line = local_c0.line;
  (__position._M_current)->column = local_c0.column;
  iVar3._M_node[2]._M_parent = (_Base_ptr)&(iVar3._M_node[2]._M_parent)->_M_right;
LAB_00150622:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CheckerVisitor::putIntoGlobalNamesMap(std::map<std::string, std::vector<IdLocation>> &map, enum DiagnosticsId diag, const SQChar *name, const Node *d) {

  std::string sourcenameCache(_ctx.sourceName());

  auto fnIt = fileNames.find(sourcenameCache);
  IdLocation loc;

  if (fnIt == fileNames.end()) {
    auto it2 = fileNames.insert(sourcenameCache);
    loc.filename = it2.first->c_str();
  }
  else {
    loc.filename = fnIt->c_str();
  }

  loc.line = d->lineStart();
  loc.column = d->columnStart();
  loc.diagSilenced = _ctx.isDisabled(diag, loc.line, loc.column);

  std::string key(name);

  auto it = map.find(key);

  if (it != map.end()) {
    it->second.push_back(loc);
  }
  else {
    auto it2 = map.insert({ key, std::vector<IdLocation>() });
    it2.first->second.push_back(loc);
  }
}